

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorText::GenerateElementData(DecoratorText *this,Element *element,BoxArea paint_area)

{
  pointer pcVar1;
  bool bVar2;
  ElementData *element_data;
  String local_40;
  
  element_data = (ElementData *)operator_new(0x28);
  element_data->paint_area = paint_area;
  (element_data->textured_geometry).
  super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (element_data->textured_geometry).
  super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (element_data->textured_geometry).
  super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  element_data->font_handle_version = -1;
  bVar2 = GenerateGeometry(this,element,element_data);
  if (!bVar2) {
    pcVar1 = (this->text)._M_dataplus._M_p;
    Element::GetAddress_abi_cxx11_(&local_40,element,false,true);
    Log::Message(LT_WARNING,"Could not construct text decorator with text %s on element %s",pcVar1,
                 local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    element_data = (ElementData *)0x0;
  }
  return (DecoratorDataHandle)element_data;
}

Assistant:

DecoratorDataHandle DecoratorText::GenerateElementData(Element* element, BoxArea paint_area) const
{
	ElementData* data = new ElementData{paint_area, {}, -1};

	if (!GenerateGeometry(element, *data))
	{
		Log::Message(Log::LT_WARNING, "Could not construct text decorator with text %s on element %s", text.c_str(), element->GetAddress().c_str());
		return {};
	}

	return reinterpret_cast<DecoratorDataHandle>(data);
}